

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.h
# Opt level: O0

Glucose_Pars Glucose_CreatePars(int p,int v,int c,int nConfls)

{
  Glucose_Pars GVar1;
  int nConfls_local;
  int c_local;
  int v_local;
  int p_local;
  Glucose_Pars pars;
  
  GVar1.verb = v;
  GVar1.pre = p;
  GVar1.cust = c;
  GVar1.nConfls = nConfls;
  return GVar1;
}

Assistant:

static inline Glucose_Pars Glucose_CreatePars(int p, int v, int c, int nConfls)
{
    Glucose_Pars pars;
    pars.pre     = p;
    pars.verb    = v;
    pars.cust    = c;
    pars.nConfls = nConfls;
    return pars;
}